

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O2

int h262_coded_block_pattern(bitstream *str,int chroma_format,uint32_t *cbp)

{
  uint uVar1;
  undefined4 in_EAX;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t tmp;
  uint32_t cbplo;
  
  _tmp = CONCAT44(*cbp,in_EAX) & 0x3fffffffff;
  if (chroma_format - 1U < 3) {
    uVar1 = *(uint *)(&DAT_00117f20 + (ulong)(chroma_format - 1U) * 4);
    iVar2 = vs_vlc(str,&cbplo,cbp_vlc);
    if (iVar2 == 0) {
      uVar3 = cbplo;
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        _tmp = CONCAT44(cbplo,(uint)((*cbp >> (uVar4 & 0x1f) & 1) != 0));
        iVar2 = vs_u(str,&tmp,1);
        if (iVar2 != 0) {
          return 1;
        }
        uVar3 = uVar3 | tmp << ((byte)uVar4 & 0x1f);
      }
      if (str->dir != VS_DECODE) {
        return 0;
      }
      *cbp = uVar3;
      return 0;
    }
  }
  else {
    fwrite("Invalid chroma format\n",0x16,1,_stderr);
  }
  return 1;
}

Assistant:

int h262_coded_block_pattern(struct bitstream *str, int chroma_format, uint32_t *cbp) {
	uint32_t cbplo = *cbp & 0x3f;
	int cbphs;
	int i;
	uint32_t val;
	switch (chroma_format) {
		case 1:
			cbphs = 0;
			break;
		case 2:
			cbphs = 2;
			break;
		case 3:
			cbphs = 6;
			break;
		default:
			fprintf(stderr, "Invalid chroma format\n");
			return 1;
	}
	if (vs_vlc(str, &cbplo, cbp_vlc)) return 1;
	val = cbplo;
	for (i = 0; i < cbphs; i++) {
		uint32_t tmp = *cbp >> i & 1;
		if (vs_u(str, &tmp, 1)) return 1;
		val |= tmp << i;
	}	
	if (str->dir == VS_DECODE)
		*cbp = val;
	return 0;
}